

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setViewport(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              *this,GLint viewportX,GLint viewportY,GLsizei viewportWidth,GLsizei viewportHeight)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  
  if ((((*(int *)(in_RDI + 0xb0) != in_ESI) || (*(int *)(in_RDI + 0xb4) != in_EDX)) ||
      (*(int *)(in_RDI + 0xb8) != in_ECX)) || (*(int *)(in_RDI + 0xbc) != in_R8D)) {
    (*GL.Viewport)(in_ESI,in_EDX,in_ECX,in_R8D);
    *(int *)(in_RDI + 0xb0) = in_ESI;
    *(int *)(in_RDI + 0xb4) = in_EDX;
    *(int *)(in_RDI + 0xb8) = in_ECX;
    *(int *)(in_RDI + 0xbc) = in_R8D;
  }
  return;
}

Assistant:

void setViewport(GLint viewportX, GLint viewportY, GLsizei viewportWidth, GLsizei viewportHeight)
	{
		if (ViewportX != viewportX || ViewportY != viewportY || ViewportWidth != viewportWidth || ViewportHeight != viewportHeight) {
			GL.Viewport(viewportX, viewportY, viewportWidth, viewportHeight);
			ViewportX = viewportX;
			ViewportY = viewportY;
			ViewportWidth = viewportWidth;
			ViewportHeight = viewportHeight;
		}
	}